

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vocab.c
# Opt level: O3

void voc_make_obj_name_from_list
               (voccxdef *ctx,char *namebuf,char **cmd,char *firstwrd,char *lastwrd)

{
  int lastwrd_00;
  ulong uVar1;
  int firstwrd_00;
  ulong uVar2;
  char *pcVar3;
  ulong uVar4;
  bool bVar5;
  
  pcVar3 = *cmd;
  if (pcVar3 == (char *)0x0) {
    firstwrd_00 = 0;
    lastwrd_00 = 0;
  }
  else {
    uVar4 = 0;
    uVar1 = 0;
    uVar2 = 0;
    do {
      firstwrd_00 = (int)uVar2;
      lastwrd_00 = (int)uVar1;
      if (*pcVar3 == '\0') break;
      if (pcVar3 == firstwrd) {
        uVar2 = uVar4 & 0xffffffff;
      }
      firstwrd_00 = (int)uVar2;
      bVar5 = pcVar3 == lastwrd;
      pcVar3 = cmd[uVar4 + 1];
      uVar4 = uVar4 + 1;
      if (bVar5) {
        uVar1 = uVar4 & 0xffffffff;
      }
      lastwrd_00 = (int)uVar1;
    } while (pcVar3 != (char *)0x0);
  }
  voc_make_obj_name(ctx,namebuf,cmd,firstwrd_00,lastwrd_00);
  return;
}

Assistant:

void voc_make_obj_name_from_list(voccxdef *ctx, char *namebuf,
                                 char *cmd[], char *firstwrd, char *lastwrd)
{
    int i, i1, i2;
    
    /* find the cmd indices */
    for (i = i1 = i2 = 0 ; cmd[i] != 0 && *cmd[i] != 0 ; ++i)
    {
        if (cmd[i] == firstwrd)
            i1 = i;
        if (cmd[i] == lastwrd)
            i2 = i + 1;
    }

    /* build the name */
    voc_make_obj_name(ctx, namebuf, cmd, i1, i2);
}